

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

void cvRescale(CVodeMem cv_mem)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = cv_mem->cv_eta;
  cv_mem->cv_cvals[0] = dVar3;
  uVar1 = cv_mem->cv_q;
  if (0 < (int)uVar1) {
    uVar2 = 0;
    dVar4 = dVar3;
    do {
      dVar4 = dVar4 * dVar3;
      cv_mem->cv_cvals[uVar2 + 1] = dVar4;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  N_VScaleVectorArray((ulong)uVar1,cv_mem->cv_cvals,cv_mem->cv_zn + 1);
  dVar3 = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_h = dVar3;
  cv_mem->cv_next_h = dVar3;
  cv_mem->cv_hscale = dVar3;
  cv_mem->cv_nscon = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j = 1; j <= cv_mem->cv_q; j++)
  {
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j - 1];
  }

  (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals, cv_mem->cv_zn + 1,
                            cv_mem->cv_zn + 1);

  cv_mem->cv_h      = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon  = 0;
}